

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

bool __thiscall wabt::interp::Store::HasValueType(Store *this,Ref ref,ValueType type)

{
  bool bVar1;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar2;
  
  bVar1 = IsValid(this,ref);
  if (bVar1) {
    if (ref.index == 0 || type.enum_ == Anyref) {
      return true;
    }
    puVar2 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::Get(&this->objects_,ref.index);
    if (type.enum_ == Funcref) {
      return ((puVar2->_M_t).
              super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
              ._M_t.
              super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
              .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl)->kind_ -
             DefinedFunc < 2;
    }
  }
  return false;
}

Assistant:

bool Store::HasValueType(Ref ref, ValueType type) const {
  // TODO opt?
  if (!IsValid(ref)) {
    return false;
  }
  if (type == ValueType::Anyref) {
    return true;
  }
  if (ref == Ref::Null) {
    return true;
  }

  Object* obj = objects_.Get(ref.index).get();
  switch (type) {
    case ValueType::Funcref:
      return obj->kind() == ObjectKind::DefinedFunc ||
             obj->kind() == ObjectKind::HostFunc;
    case ValueType::Nullref:
      return ref.index == 0;
    case ValueType::Exnref:  // TODO
      return false;
    default:
      return false;
  }
}